

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArHosekSkyModel.c
# Opt level: O3

double arhosekskymodel_solar_radiance
                 (ArHosekSkyModelState *state,double theta,double gamma,double wavelength)

{
  double dVar1;
  double dVar2;
  
  dVar1 = arhosekskymodel_solar_radiance_internal2
                    (state,wavelength,1.5707963267948966 - theta,gamma);
  dVar2 = arhosekskymodel_radiance(state,theta,gamma,wavelength);
  return dVar2 + dVar1;
}

Assistant:

double arhosekskymodel_solar_radiance(
        ArHosekSkyModelState  * state,
        double                  theta, 
        double                  gamma, 
        double                  wavelength
        )
{
    double  direct_radiance =
        arhosekskymodel_solar_radiance_internal2(
            state,
            wavelength,
            ((MATH_PI/2.0)-theta),
            gamma
            );

    double  inscattered_radiance =
        arhosekskymodel_radiance(
            state,
            theta,
            gamma,
            wavelength
            );
    
    return  direct_radiance + inscattered_radiance;
}